

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManComputeOverlap(Gia_Man_t *p)

{
  int iVar1;
  int local_18;
  int local_14;
  int Count;
  int i;
  Gia_Man_t *p_local;
  
  local_18 = Gia_ManAndNum(p);
  local_18 = -local_18;
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x176,"int Gia_ManComputeOverlap(Gia_Man_t *)");
  }
  for (local_14 = 1; iVar1 = Gia_ManObjNum(p), local_14 < iVar1; local_14 = local_14 + 1) {
    iVar1 = Gia_ObjIsLut(p,local_14);
    if (iVar1 != 0) {
      iVar1 = Gia_ManComputeOverlapOne(p,local_14);
      local_18 = iVar1 + local_18;
    }
  }
  return local_18;
}

Assistant:

int Gia_ManComputeOverlap( Gia_Man_t * p )
{
    int i, Count = -Gia_ManAndNum(p);
    assert( Gia_ManHasMapping(p) );
    Gia_ManForEachLut( p, i )
        Count += Gia_ManComputeOverlapOne( p, i );
    return Count;
}